

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQObject __thiscall SQCompiler::Expect(SQCompiler *this,SQInteger tok)

{
  SQFuncState *this_00;
  SQChar *s;
  SQUnsignedInteger SVar1;
  SQObject SVar2;
  SQObjectPtr local_90;
  SQObjectPtr local_80;
  SQObject local_70 [2];
  SQObject local_50;
  undefined1 auStack_40 [8];
  SQObjectPtr ret;
  SQChar *etypename;
  SQInteger tok_local;
  SQCompiler *this_local;
  
  if ((this->_token != tok) && ((this->_token != 0x136 || (tok != 0x102)))) {
    if (0xff < tok) {
      switch(tok) {
      case 0x102:
        ret.super_SQObject._unVal.pTable = (SQTable *)anon_var_dwarf_6eaf;
        break;
      case 0x103:
        ret.super_SQObject._unVal.pTable = (SQTable *)anon_var_dwarf_6eb9;
        break;
      case 0x104:
        ret.super_SQObject._unVal.pTable = (SQTable *)anon_var_dwarf_6ecf;
        break;
      case 0x105:
        ret.super_SQObject._unVal.pTable = (SQTable *)anon_var_dwarf_6ed9;
        break;
      default:
        ret.super_SQObject._unVal.pTable = (SQTable *)SQLexer::Tok2Str(&this->_lex,tok);
      }
      Error(this,"expected \'%s\'",ret.super_SQObject._unVal.pTable);
    }
    Error(this,"expected \'%c\'",tok);
  }
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)auStack_40);
  switch(tok) {
  case 0x102:
    SVar2 = SQFuncState::CreateString(this->_fs,(this->_lex)._svalue,-1);
    local_50._unVal = SVar2._unVal;
    local_50._type = SVar2._type;
    ::SQObjectPtr::operator=((SQObjectPtr *)auStack_40,&local_50);
    break;
  case 0x103:
    this_00 = this->_fs;
    s = (this->_lex)._svalue;
    SVar1 = sqvector<char>::size(&(this->_lex)._longstr);
    SVar2 = SQFuncState::CreateString(this_00,s,SVar1 - 1);
    local_70[0]._unVal = SVar2._unVal;
    local_70[0]._type = SVar2._type;
    ::SQObjectPtr::operator=((SQObjectPtr *)auStack_40,local_70);
    break;
  case 0x104:
    ::SQObjectPtr::SQObjectPtr(&local_80,(this->_lex)._nvalue);
    ::SQObjectPtr::operator=((SQObjectPtr *)auStack_40,&local_80);
    ::SQObjectPtr::~SQObjectPtr(&local_80);
    break;
  case 0x105:
    ::SQObjectPtr::SQObjectPtr(&local_90,(this->_lex)._fvalue);
    ::SQObjectPtr::operator=((SQObjectPtr *)auStack_40,&local_90);
    ::SQObjectPtr::~SQObjectPtr(&local_90);
  }
  Lex(this);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)auStack_40);
  SVar2._0_8_ = (ulong)auStack_40 & 0xffffffff;
  SVar2._unVal = (SQObjectValue)ret.super_SQObject._0_8_;
  return SVar2;
}

Assistant:

SQObject Expect(SQInteger tok)
    {

        if(_token != tok) {
            if(_token == TK_CONSTRUCTOR && tok == TK_IDENTIFIER) {
                //do nothing
            }
            else {
                const SQChar *etypename;
                if(tok > 255) {
                    switch(tok)
                    {
                    case TK_IDENTIFIER:
                        etypename = _SC("IDENTIFIER");
                        break;
                    case TK_STRING_LITERAL:
                        etypename = _SC("STRING_LITERAL");
                        break;
                    case TK_INTEGER:
                        etypename = _SC("INTEGER");
                        break;
                    case TK_FLOAT:
                        etypename = _SC("FLOAT");
                        break;
                    default:
                        etypename = _lex.Tok2Str(tok);
                    }
                    Error(_SC("expected '%s'"), etypename);
                }
                Error(_SC("expected '%c'"), tok);
            }
        }
        SQObjectPtr ret;
        switch(tok)
        {
        case TK_IDENTIFIER:
            ret = _fs->CreateString(_lex._svalue);
            break;
        case TK_STRING_LITERAL:
            ret = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
            break;
        case TK_INTEGER:
            ret = SQObjectPtr(_lex._nvalue);
            break;
        case TK_FLOAT:
            ret = SQObjectPtr(_lex._fvalue);
            break;
        }
        Lex();
        return ret;
    }